

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O2

void proto3_unittest::TestOneof2::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  int iVar1;
  Nullable<const_char_*> failure_msg;
  TestOneof2 *_this;
  TestOneof2 *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestOneof2 *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto3_unittest::TestOneof2_const*,proto3_unittest::TestOneof2*>
                          ((TestOneof2 **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    iVar1 = (int)from_msg[1]._internal_metadata_.ptr_;
    if (iVar1 != 0) {
      if (*(int *)((long)&local_20->field_0 + 8) != iVar1) {
        *(int *)((long)&local_20->field_0 + 8) = iVar1;
      }
      if (iVar1 == 6) {
        (local_20->field_0)._impl_.foo_ = *(FooUnion *)&from_msg[1]._vptr_MessageLite;
      }
    }
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3.pb.cc"
             ,0x15c1,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TestOneof2::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestOneof2*>(&to_msg);
  auto& from = static_cast<const TestOneof2&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.TestOneof2)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_foo();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kFooEnum: {
        _this->_impl_.foo_.foo_enum_ = from._impl_.foo_.foo_enum_;
        break;
      }
      case FOO_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}